

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

int scope_metadata_array(scope sp,value *v_array)

{
  value pvVar1;
  value pvVar2;
  value v;
  undefined8 *in_RSI;
  long in_RDI;
  value objects_val;
  value classes_val;
  value functions_val;
  scope_metadata_array_cb_iterator_type metadata_iterator;
  size_t in_stack_ffffffffffffff98;
  value *in_stack_ffffffffffffffa0;
  value *local_48;
  value *local_40;
  value *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  long local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_48,0,0x30);
  set_iterate(*(undefined8 *)(local_10 + 8),scope_metadata_array_cb_iterate_counter,&local_48);
  pvVar1 = value_create_array(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (pvVar1 == (value)0x0) {
    local_4 = 1;
  }
  else {
    local_48 = value_to_array((value)0x10d2eb);
    pvVar2 = value_create_array(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (pvVar2 == (value)0x0) {
      value_destroy(in_stack_ffffffffffffffa0);
      local_4 = 1;
    }
    else {
      local_40 = value_to_array((value)0x10d32c);
      v = value_create_array(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (v == (value)0x0) {
        value_destroy((value)0x0);
        value_destroy(v);
        local_4 = 1;
      }
      else {
        local_38 = value_to_array((value)0x10d374);
        local_28 = 0;
        local_30 = 0;
        local_20 = 0;
        set_iterate(*(undefined8 *)(local_10 + 8),scope_metadata_array_cb_iterate,&local_48);
        *local_18 = pvVar1;
        local_18[1] = pvVar2;
        local_18[2] = v;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int scope_metadata_array(scope sp, value v_array[3])
{
	struct scope_metadata_array_cb_iterator_type metadata_iterator = {
		NULL, NULL, NULL, 0, 0, 0
	};

	set_iterate(sp->objects, &scope_metadata_array_cb_iterate_counter, (set_cb_iterate_args)&metadata_iterator);

	value functions_val = value_create_array(NULL, metadata_iterator.functions_size);

	if (functions_val == NULL)
	{
		return 1;
	}

	metadata_iterator.functions = value_to_array(functions_val);

	value classes_val = value_create_array(NULL, metadata_iterator.classes_size);

	if (classes_val == NULL)
	{
		value_destroy(functions_val);
		return 1;
	}

	metadata_iterator.classes = value_to_array(classes_val);

	value objects_val = value_create_array(NULL, metadata_iterator.objects_size);

	if (objects_val == NULL)
	{
		value_destroy(functions_val);
		value_destroy(classes_val);
		return 1;
	}

	metadata_iterator.objects = value_to_array(objects_val);

	/* Reuse counters to fill the arrays */
	metadata_iterator.classes_size = 0;
	metadata_iterator.functions_size = 0;
	metadata_iterator.objects_size = 0;

	set_iterate(sp->objects, &scope_metadata_array_cb_iterate, (set_cb_iterate_args)&metadata_iterator);

	v_array[0] = functions_val;
	v_array[1] = classes_val;
	v_array[2] = objects_val;

	return 0;
}